

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbrReach.c
# Opt level: O1

int Aig_ManComputeReachable
              (DdManager *dd,Aig_Man_t *p,DdNode **pbParts,DdNode *bInitial,DdNode **pbOutputs,
              Saig_ParBbr_t *pPars,int fCheckOutputs)

{
  FILE *pFVar1;
  Aig_Man_t *pAVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  DdNode *pDVar6;
  Bbr_ImageTree_t *pTree;
  Vec_Ptr_t *vOnionRings;
  void **ppvVar7;
  DdNode *pDVar8;
  Abc_Cex_t *pAVar9;
  long lVar10;
  ulong uVar11;
  char *__format;
  DdManager *pDVar12;
  bool bVar13;
  double dVar14;
  double dVar15;
  ulong local_b8;
  uint local_a4;
  Bbr_ImageTree2_t *local_a0;
  DdNode *local_80;
  Cudd_ReorderingType method;
  long local_68;
  Aig_Man_t *local_60;
  timespec ts;
  
  iVar3 = clock_gettime(3,(timespec *)&ts);
  if (iVar3 < 0) {
    local_68 = 1;
  }
  else {
    lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
    local_68 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + ts.tv_sec * -1000000;
  }
  iVar3 = Cudd_ReorderingStatus(dd,&method);
  if (iVar3 != 0) {
    Cudd_AutodynDisable(dd);
  }
  pDVar6 = Bbr_bddComputeRangeCube(dd,p->nTruePis,p->nRegs + p->nTruePis);
  Cudd_Ref(pDVar6);
  iVar4 = p->nRegs;
  if (pPars->fPartition == 0) {
    local_a0 = Bbr_bddImageStart2(dd,pDVar6,iVar4,pbParts,iVar4,
                                  dd->vars + (long)p->nTruePis + (long)iVar4,pPars->fVerbose);
    pTree = (Bbr_ImageTree_t *)0x0;
  }
  else {
    pTree = Bbr_bddImageStart(dd,pDVar6,iVar4,pbParts,iVar4,
                              dd->vars + (long)p->nTruePis + (long)iVar4,pPars->nBddMax,
                              pPars->fVerbose);
    local_a0 = (Bbr_ImageTree2_t *)0x0;
  }
  Cudd_RecursiveDeref(dd,pDVar6);
  if (pTree == (Bbr_ImageTree_t *)0x0) {
    if (pPars->fSilent != 0) {
      return -1;
    }
    printf("BDDs blew up during qualitification scheduling.  ");
    return -1;
  }
  if (iVar3 != 0) {
    Cudd_AutodynEnable(dd,method);
  }
  vOnionRings = (Vec_Ptr_t *)malloc(0x10);
  vOnionRings->nCap = 1000;
  vOnionRings->nSize = 0;
  ppvVar7 = (void **)malloc(8000);
  vOnionRings->pArray = ppvVar7;
  Cudd_Ref(bInitial);
  Cudd_Ref(bInitial);
  uVar5 = vOnionRings->nCap;
  if (vOnionRings->nSize == uVar5) {
    if ((int)uVar5 < 0x10) {
      if (vOnionRings->pArray == (void **)0x0) {
        ppvVar7 = (void **)malloc(0x80);
      }
      else {
        ppvVar7 = (void **)realloc(vOnionRings->pArray,0x80);
      }
      iVar3 = 0x10;
    }
    else {
      iVar3 = uVar5 * 2;
      if (iVar3 <= (int)uVar5) goto LAB_00829284;
      if (vOnionRings->pArray == (void **)0x0) {
        ppvVar7 = (void **)malloc((ulong)uVar5 << 4);
      }
      else {
        ppvVar7 = (void **)realloc(vOnionRings->pArray,(ulong)uVar5 << 4);
      }
    }
    vOnionRings->pArray = ppvVar7;
    vOnionRings->nCap = iVar3;
  }
LAB_00829284:
  iVar3 = vOnionRings->nSize;
  vOnionRings->nSize = iVar3 + 1;
  vOnionRings->pArray[iVar3] = bInitial;
  Cudd_Ref(bInitial);
  if (pPars->nIterMax < 1) {
    bVar13 = true;
    local_b8 = 0;
    local_a4 = 0;
    pDVar6 = (DdNode *)0x0;
  }
  else {
    local_a4 = 0;
    local_b8 = 0;
    local_80 = bInitial;
    local_60 = p;
    do {
      p = local_60;
      iVar3 = pPars->TimeLimit;
      if ((long)iVar3 != 0) {
        iVar4 = clock_gettime(3,(timespec *)&ts);
        if (iVar4 < 0) {
          lVar10 = -1;
        }
        else {
          lVar10 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
        }
        if ((long)iVar3 <= (lVar10 + local_68) / 1000000) {
          printf("Reached timeout after image computation (%d seconds).\n",
                 (ulong)(uint)pPars->TimeLimit);
          if (vOnionRings->pArray != (void **)0x0) {
            free(vOnionRings->pArray);
            vOnionRings->pArray = (void **)0x0;
          }
          free(vOnionRings);
          if (pPars->fPartition == 0) {
            Bbr_bddImageTreeDelete2(local_a0);
          }
          else {
            Bbr_bddImageTreeDelete(pTree);
          }
          goto LAB_0082994f;
        }
      }
      if (pPars->fPartition == 0) {
        pDVar8 = Bbr_bddImageCompute2(local_a0,local_80);
      }
      else {
        pDVar8 = Bbr_bddImageCompute(pTree,local_80);
      }
      if (pDVar8 == (DdNode *)0x0) {
        if (pPars->fSilent == 0) {
          printf("BDDs blew up during image computation.  ");
        }
        if (pPars->fPartition == 0) {
          Bbr_bddImageTreeDelete2(local_a0);
        }
        else {
          Bbr_bddImageTreeDelete(pTree);
        }
        if (vOnionRings->pArray != (void **)0x0) {
          free(vOnionRings->pArray);
          vOnionRings->pArray = (void **)0x0;
        }
        free(vOnionRings);
        goto LAB_0082994f;
      }
      Cudd_Ref(pDVar8);
      Cudd_RecursiveDeref(dd,local_80);
      pDVar6 = Cudd_bddVarMap(dd,pDVar8);
      Cudd_Ref(pDVar6);
      Cudd_RecursiveDeref(dd,pDVar8);
      iVar3 = Cudd_bddLeq(dd,pDVar6,bInitial);
      bVar13 = iVar3 == 0;
      if ((!bVar13) || (local_a4 = Cudd_DagSize(pDVar6), pPars->nBddMax < (int)local_a4)) break;
      pDVar8 = bInitial;
      if (p->nTruePos < 1) {
        uVar11 = 0;
      }
      else {
        uVar11 = 0;
        do {
          if ((fCheckOutputs != 0) &&
             (iVar3 = Cudd_bddLeq(dd,pDVar6,(DdNode *)((ulong)pbOutputs[uVar11] ^ 1)), iVar3 == 0))
          {
            pDVar8 = Cudd_bddIntersect(dd,pDVar6,pbOutputs[uVar11]);
            Cudd_Ref(pDVar8);
            if (p->pSeqModel != (Abc_Cex_t *)0x0) {
              __assert_fail("p->pSeqModel == NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/bbr/bbrReach.c"
                            ,0x151,
                            "int Aig_ManComputeReachable(DdManager *, Aig_Man_t *, DdNode **, DdNode *, DdNode **, Saig_ParBbr_t *, int)"
                           );
            }
            pAVar9 = Aig_ManVerifyUsingBddsCountExample
                               (p,dd,pbParts,vOnionRings,pDVar8,(int)uVar11,pPars->fVerbose,
                                pPars->fSilent);
            p->pSeqModel = pAVar9;
            pDVar12 = dd;
            Cudd_RecursiveDeref(dd,pDVar8);
            if (pPars->fSilent == 0) {
              Abc_Print((int)pDVar12,"Output %d of miter \"%s\" was asserted in frame %d. ",
                        uVar11 & 0xffffffff,p->pName,(ulong)(uint)vOnionRings->nSize);
            }
            Cudd_RecursiveDeref(dd,bInitial);
            pPars->iFrame = (int)local_b8;
            pDVar8 = (DdNode *)0x0;
            break;
          }
          uVar11 = uVar11 + 1;
        } while ((long)uVar11 < (long)p->nTruePos);
      }
      bInitial = pDVar8;
      if ((int)uVar11 < p->nTruePos) break;
      local_80 = Cudd_bddAnd(dd,pDVar6,(DdNode *)((ulong)pDVar8 ^ 1));
      Cudd_Ref(local_80);
      uVar5 = vOnionRings->nCap;
      if (vOnionRings->nSize == uVar5) {
        if ((int)uVar5 < 0x10) {
          if (vOnionRings->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc(0x80);
          }
          else {
            ppvVar7 = (void **)realloc(vOnionRings->pArray,0x80);
          }
          iVar3 = 0x10;
        }
        else {
          iVar3 = uVar5 * 2;
          if (iVar3 <= (int)uVar5) goto LAB_0082956a;
          if (vOnionRings->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc((ulong)uVar5 << 4);
          }
          else {
            ppvVar7 = (void **)realloc(vOnionRings->pArray,(ulong)uVar5 << 4);
          }
        }
        vOnionRings->pArray = ppvVar7;
        vOnionRings->nCap = iVar3;
      }
LAB_0082956a:
      iVar3 = vOnionRings->nSize;
      vOnionRings->nSize = iVar3 + 1;
      vOnionRings->pArray[iVar3] = local_80;
      Cudd_Ref(local_80);
      bInitial = Cudd_bddOr(dd,pDVar8,pDVar6);
      Cudd_Ref(bInitial);
      Cudd_RecursiveDeref(dd,pDVar8);
      Cudd_RecursiveDeref(dd,pDVar6);
      if (pPars->fVerbose != 0) {
        fprintf(_stdout,"Frame = %3d. BDD = %5d. ",local_b8,(ulong)local_a4);
      }
      if (pPars->fVerbose != 0) {
        fputc(10,_stdout);
      }
      pAVar2 = local_60;
      if (pPars->fVerbose != 0) {
        dVar14 = Cudd_CountMinterm(dd,bInitial,local_60->nRegs);
        pFVar1 = _stdout;
        dVar15 = ldexp(1.0,pAVar2->nRegs);
        fprintf(pFVar1,"Reachable states = %.0f. (Ratio = %.4f %%)\n",dVar14,
                (dVar14 * 100.0) / dVar15);
        fflush(_stdout);
      }
      uVar5 = (int)local_b8 + 1;
      local_b8 = (ulong)uVar5;
      p = local_60;
    } while ((int)uVar5 < pPars->nIterMax);
  }
  Cudd_RecursiveDeref(dd,pDVar6);
  if (0 < vOnionRings->nSize) {
    lVar10 = 0;
    do {
      Cudd_RecursiveDeref(dd,(DdNode *)vOnionRings->pArray[lVar10]);
      lVar10 = lVar10 + 1;
    } while (lVar10 < vOnionRings->nSize);
  }
  if (vOnionRings->pArray != (void **)0x0) {
    free(vOnionRings->pArray);
    vOnionRings->pArray = (void **)0x0;
  }
  free(vOnionRings);
  if (pPars->fPartition == 0) {
    Bbr_bddImageTreeDelete2(local_a0);
  }
  else {
    Bbr_bddImageTreeDelete(pTree);
  }
  if (bInitial == (DdNode *)0x0) {
    iVar3 = 0;
  }
  else {
    iVar3 = (int)local_b8;
    if (pPars->fVerbose != 0) {
      dVar14 = Cudd_CountMinterm(dd,bInitial,p->nRegs);
      if (pPars->nIterMax < iVar3) {
        __format = "Reachability analysis is stopped after %d frames.\n";
      }
      else {
        __format = "Reachability analysis completed after %d frames.\n";
        if (pPars->nBddMax < (int)local_a4) {
          __format = "Reachability analysis is stopped after %d frames.\n";
        }
      }
      fprintf(_stdout,__format);
      pFVar1 = _stdout;
      dVar15 = ldexp(1.0,p->nRegs);
      fprintf(pFVar1,"Reachable states = %.0f. (Ratio = %.4f %%)\n",dVar14,(dVar14 * 100.0) / dVar15
             );
      fflush(_stdout);
    }
    Cudd_RecursiveDeref(dd,bInitial);
    if (bVar13) {
      if ((iVar3 < pPars->nIterMax) && ((int)local_a4 < pPars->nBddMax)) {
        __assert_fail("nIters >= pPars->nIterMax || nBddSize >= pPars->nBddMax",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/bbr/bbrReach.c"
                      ,0x1a4,
                      "int Aig_ManComputeReachable(DdManager *, Aig_Man_t *, DdNode **, DdNode *, DdNode **, Saig_ParBbr_t *, int)"
                     );
      }
      if (pPars->fSilent == 0) {
        printf("Verified only for states reachable in %d frames.  ",local_b8);
      }
LAB_0082994f:
      pPars->iFrame = (int)local_b8 + -1;
      iVar3 = -1;
    }
    else {
      if (pPars->fSilent == 0) {
        printf("The miter is proved unreachable after %d iterations.  ",local_b8);
      }
      pPars->iFrame = iVar3 + -1;
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

int Aig_ManComputeReachable( DdManager * dd, Aig_Man_t * p, DdNode ** pbParts, DdNode * bInitial, DdNode ** pbOutputs, Saig_ParBbr_t * pPars, int fCheckOutputs )
{
    int fInternalReorder = 0;
    Bbr_ImageTree_t * pTree = NULL; // Suppress "might be used uninitialized"
    Bbr_ImageTree2_t * pTree2 = NULL; // Supprses "might be used uninitialized"
    DdNode * bReached, * bCubeCs;
    DdNode * bCurrent;
    DdNode * bNext = NULL; // Suppress "might be used uninitialized"
    DdNode * bTemp;
    Cudd_ReorderingType method;
    int i, nIters, nBddSize = 0, status;
    int nThreshold = 10000;
    abctime clk = Abc_Clock();
    Vec_Ptr_t * vOnionRings;
    int fixedPoint = 0;

    status = Cudd_ReorderingStatus( dd, &method );
    if ( status )
        Cudd_AutodynDisable( dd );

    // start the image computation
    bCubeCs  = Bbr_bddComputeRangeCube( dd, Saig_ManPiNum(p), Saig_ManCiNum(p) );    Cudd_Ref( bCubeCs );
    if ( pPars->fPartition )
        pTree = Bbr_bddImageStart( dd, bCubeCs, Saig_ManRegNum(p), pbParts, Saig_ManRegNum(p), dd->vars+Saig_ManCiNum(p), pPars->nBddMax, pPars->fVerbose );
    else
        pTree2 = Bbr_bddImageStart2( dd, bCubeCs, Saig_ManRegNum(p), pbParts, Saig_ManRegNum(p), dd->vars+Saig_ManCiNum(p), pPars->fVerbose );
    Cudd_RecursiveDeref( dd, bCubeCs );
    if ( pTree == NULL )
    {
        if ( !pPars->fSilent )
            printf( "BDDs blew up during qualitification scheduling.  " );
        return -1;
    }

    if ( status )
        Cudd_AutodynEnable( dd, method );

    // start the onion rings
    vOnionRings = Vec_PtrAlloc( 1000 );

    // perform reachability analysis
    bCurrent = bInitial;   Cudd_Ref( bCurrent );
    bReached = bInitial;   Cudd_Ref( bReached );
    Vec_PtrPush( vOnionRings, bCurrent );  Cudd_Ref( bCurrent );
    for ( nIters = 0; nIters < pPars->nIterMax; nIters++ )
    { 
        // check the runtime limit
        if ( pPars->TimeLimit && pPars->TimeLimit <= (Abc_Clock()-clk)/CLOCKS_PER_SEC )
        {
            printf( "Reached timeout after image computation (%d seconds).\n",  pPars->TimeLimit );
            Vec_PtrFree( vOnionRings );
            // undo the image tree
            if ( pPars->fPartition )
                Bbr_bddImageTreeDelete( pTree );
            else
                Bbr_bddImageTreeDelete2( pTree2 );
            pPars->iFrame = nIters - 1;
            return -1;
        }

        // compute the next states
        if ( pPars->fPartition )
            bNext = Bbr_bddImageCompute( pTree, bCurrent );           
        else
            bNext = Bbr_bddImageCompute2( pTree2, bCurrent );  
        if ( bNext == NULL )
        {
            if ( !pPars->fSilent )
                printf( "BDDs blew up during image computation.  " );
            if ( pPars->fPartition )
                Bbr_bddImageTreeDelete( pTree );
            else
                Bbr_bddImageTreeDelete2( pTree2 );
            Vec_PtrFree( vOnionRings );
            pPars->iFrame = nIters - 1;
            return -1;
        }
        Cudd_Ref( bNext );
        Cudd_RecursiveDeref( dd, bCurrent );

        // remap these states into the current state vars
        bNext = Cudd_bddVarMap( dd, bTemp = bNext );                    Cudd_Ref( bNext );
        Cudd_RecursiveDeref( dd, bTemp );
        // check if there are any new states
        if ( Cudd_bddLeq( dd, bNext, bReached ) ) {
            fixedPoint = 1;
            break;
        }
        // check the BDD size
        nBddSize = Cudd_DagSize(bNext);
        if ( nBddSize > pPars->nBddMax )
            break;
        // check the result
        for ( i = 0; i < Saig_ManPoNum(p); i++ )
        {
            if ( fCheckOutputs && !Cudd_bddLeq( dd, bNext, Cudd_Not(pbOutputs[i]) ) )
            {
                DdNode * bIntersect;
                bIntersect = Cudd_bddIntersect( dd, bNext, pbOutputs[i] );  Cudd_Ref( bIntersect );
                assert( p->pSeqModel == NULL );
                p->pSeqModel = Aig_ManVerifyUsingBddsCountExample( p, dd, pbParts, 
                    vOnionRings, bIntersect, i, pPars->fVerbose, pPars->fSilent ); 
                Cudd_RecursiveDeref( dd, bIntersect );
                if ( !pPars->fSilent )
                    Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d. ", i, p->pName, Vec_PtrSize(vOnionRings) );
                Cudd_RecursiveDeref( dd, bReached );
                bReached = NULL;
                pPars->iFrame = nIters;
                break;
            }
        }
        if ( i < Saig_ManPoNum(p) )
            break;
        // get the new states
        bCurrent = Cudd_bddAnd( dd, bNext, Cudd_Not(bReached) );        Cudd_Ref( bCurrent );
        Vec_PtrPush( vOnionRings, bCurrent );  Cudd_Ref( bCurrent );
        // minimize the new states with the reached states
//        bCurrent = Cudd_bddConstrain( dd, bTemp = bCurrent, Cudd_Not(bReached) ); Cudd_Ref( bCurrent );
//        Cudd_RecursiveDeref( dd, bTemp );
        // add to the reached states
        bReached = Cudd_bddOr( dd, bTemp = bReached, bNext );           Cudd_Ref( bReached );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bNext );
        if ( pPars->fVerbose )
            fprintf( stdout, "Frame = %3d. BDD = %5d. ", nIters, nBddSize );
        if ( fInternalReorder && pPars->fReorder && nBddSize > nThreshold )
        {
            if ( pPars->fVerbose )
                fprintf( stdout, "Reordering... Before = %5d. ", Cudd_DagSize(bReached) );
            Cudd_ReduceHeap( dd, CUDD_REORDER_SYMM_SIFT, 100 );
            Cudd_AutodynDisable( dd );
            if ( pPars->fVerbose )
                fprintf( stdout, "After = %5d.\r", Cudd_DagSize(bReached) );
            nThreshold *= 2;
        }
        if ( pPars->fVerbose )
//            fprintf( stdout, "\r" );
            fprintf( stdout, "\n" );

        if ( pPars->fVerbose )
        {
            double nMints = Cudd_CountMinterm(dd, bReached, Saig_ManRegNum(p) );
//            Extra_bddPrint( dd, bReached );printf( "\n" );
            fprintf( stdout, "Reachable states = %.0f. (Ratio = %.4f %%)\n", nMints, 100.0*nMints/pow(2.0, Saig_ManRegNum(p)) );
            fflush( stdout ); 
        }

    }
    Cudd_RecursiveDeref( dd, bNext );
    // free the onion rings
    Vec_PtrForEachEntry( DdNode *, vOnionRings, bTemp, i )
        Cudd_RecursiveDeref( dd, bTemp );
    Vec_PtrFree( vOnionRings );
    // undo the image tree
    if ( pPars->fPartition )
        Bbr_bddImageTreeDelete( pTree );
    else
        Bbr_bddImageTreeDelete2( pTree2 );
    if ( bReached == NULL )
        return 0; // proved reachable
    // report the stats
    if ( pPars->fVerbose )
    {
        double nMints = Cudd_CountMinterm(dd, bReached, Saig_ManRegNum(p) );
        if ( nIters > pPars->nIterMax || nBddSize > pPars->nBddMax )
            fprintf( stdout, "Reachability analysis is stopped after %d frames.\n", nIters );
        else
            fprintf( stdout, "Reachability analysis completed after %d frames.\n", nIters );
        fprintf( stdout, "Reachable states = %.0f. (Ratio = %.4f %%)\n", nMints, 100.0*nMints/pow(2.0, Saig_ManRegNum(p)) );
        fflush( stdout );
    }
//ABC_PRB( dd, bReached );
    Cudd_RecursiveDeref( dd, bReached );
    // SPG
    //
    if ( fixedPoint ) {
      if ( !pPars->fSilent ) {
        printf( "The miter is proved unreachable after %d iterations.  ", nIters );
      }
      pPars->iFrame = nIters - 1;
      return 1;
    }
    assert(nIters >= pPars->nIterMax || nBddSize >= pPars->nBddMax);
    if ( !pPars->fSilent )
      printf( "Verified only for states reachable in %d frames.  ", nIters );
    pPars->iFrame = nIters - 1;
    return -1; // undecided
}